

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O3

void layout_to_channel_map(cubeb_channel_layout layout,pa_channel_map *cm)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  pa_channel_position_t pVar5;
  ulong uVar4;
  
  uVar4 = (ulong)layout;
  (*cubeb_pa_channel_map_init)(cm);
  if (layout != 0) {
    uVar1 = 0;
    bVar2 = 0;
    do {
      uVar3 = (uint)uVar4;
      if ((uVar4 & 1) != 0) {
        pVar5 = (uVar3 & 1) << (bVar2 & 0x1f);
        if (pVar5 < 0x200) {
          if (pVar5 < PA_CHANNEL_POSITION_AUX20) {
            if (pVar5 < PA_CHANNEL_POSITION_FRONT_LEFT_OF_CENTER) {
              if (1 < (uint)(pVar5 + PA_CHANNEL_POSITION_INVALID)) {
                if (pVar5 == PA_CHANNEL_POSITION_REAR_CENTER) {
                  pVar5 = PA_CHANNEL_POSITION_CENTER;
                }
                else {
LAB_0011d64a:
                  pVar5 = PA_CHANNEL_POSITION_INVALID;
                }
              }
            }
            else if (pVar5 == PA_CHANNEL_POSITION_FRONT_LEFT_OF_CENTER) {
              pVar5 = PA_CHANNEL_POSITION_LFE;
            }
            else {
              if (pVar5 != PA_CHANNEL_POSITION_AUX4) goto LAB_0011d64a;
              pVar5 = PA_CHANNEL_POSITION_REAR_LEFT;
            }
          }
          else if (pVar5 < 0x80) {
            if (pVar5 == PA_CHANNEL_POSITION_AUX20) {
              pVar5 = PA_CHANNEL_POSITION_REAR_RIGHT;
            }
            else {
              if (pVar5 != 0x40) goto LAB_0011d64a;
              pVar5 = PA_CHANNEL_POSITION_FRONT_LEFT_OF_CENTER;
            }
          }
          else if (pVar5 == 0x80) {
            pVar5 = PA_CHANNEL_POSITION_FRONT_RIGHT_OF_CENTER;
          }
          else {
            if (pVar5 != 0x100) goto LAB_0011d64a;
            pVar5 = PA_CHANNEL_POSITION_REAR_CENTER;
          }
        }
        else if (pVar5 < 0x2000) {
          if (pVar5 < 0x800) {
            if (pVar5 == 0x200) {
              pVar5 = PA_CHANNEL_POSITION_SIDE_LEFT;
            }
            else {
              if (pVar5 != 0x400) goto LAB_0011d64a;
              pVar5 = PA_CHANNEL_POSITION_SIDE_RIGHT;
            }
          }
          else if (pVar5 == 0x800) {
            pVar5 = PA_CHANNEL_POSITION_TOP_CENTER;
          }
          else {
            if (pVar5 != 0x1000) goto LAB_0011d64a;
            pVar5 = PA_CHANNEL_POSITION_TOP_FRONT_LEFT;
          }
        }
        else if (pVar5 < 0x8000) {
          if (pVar5 == 0x2000) {
            pVar5 = PA_CHANNEL_POSITION_TOP_FRONT_CENTER;
          }
          else {
            if (pVar5 != 0x4000) goto LAB_0011d64a;
            pVar5 = PA_CHANNEL_POSITION_TOP_FRONT_RIGHT;
          }
        }
        else if (pVar5 == 0x8000) {
          pVar5 = PA_CHANNEL_POSITION_TOP_REAR_LEFT;
        }
        else if (pVar5 == 0x10000) {
          pVar5 = PA_CHANNEL_POSITION_TOP_REAR_CENTER;
        }
        else {
          if (pVar5 != 0x20000) goto LAB_0011d64a;
          pVar5 = PA_CHANNEL_POSITION_TOP_REAR_RIGHT;
        }
        cm->map[uVar1] = pVar5;
        uVar1 = uVar1 + 1;
      }
      uVar4 = uVar4 >> 1;
      bVar2 = bVar2 + 1;
    } while (1 < uVar3);
  }
  uVar1 = cubeb_channel_layout_nb_channels(layout);
  cm->channels = (uint8_t)uVar1;
  if (((uint8_t)uVar1 == '\x01') && (cm->map[0] == PA_CHANNEL_POSITION_CENTER)) {
    cm->map[0] = PA_CHANNEL_POSITION_MONO;
  }
  return;
}

Assistant:

static void
layout_to_channel_map(cubeb_channel_layout layout, pa_channel_map * cm)
{
  assert(cm && layout != CUBEB_LAYOUT_UNDEFINED);

  WRAP(pa_channel_map_init)(cm);

  uint32_t channels = 0;
  cubeb_channel_layout channelMap = layout;
  for (uint32_t i = 0 ; channelMap != 0; ++i) {
    uint32_t channel = (channelMap & 1) << i;
    if (channel != 0) {
      cm->map[channels] = cubeb_channel_to_pa_channel(channel);
      channels++;
    }
    channelMap = channelMap >> 1;
  }
  unsigned int channels_from_layout = cubeb_channel_layout_nb_channels(layout);
  assert(channels_from_layout <= UINT8_MAX);
  cm->channels = (uint8_t) channels_from_layout;

  // Special case single channel center mapping as mono.
  if (cm->channels == 1 && cm->map[0] == PA_CHANNEL_POSITION_FRONT_CENTER) {
    cm->map[0] = PA_CHANNEL_POSITION_MONO;
  }
}